

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

string * __thiscall CLI::App::get_display_name_abi_cxx11_(string *__return_storage_ptr__,App *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  if ((this->name_)._M_string_length == 0) {
    ::std::operator+(&local_30,"[Option Group: ",&this->group_);
    ::std::operator+(__return_storage_ptr__,&local_30,"]");
    ::std::__cxx11::string::~string((string *)&local_30);
  }
  else {
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->name_);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string get_display_name() const { return (!name_.empty()) ? name_ : "[Option Group: " + get_group() + "]"; }